

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-math.c
# Opt level: O0

double ContextToDouble(RunnerContext *context)

{
  int type;
  RunnerContext *context_local;
  
  switch(context->dataType) {
  case BOOLEAN:
    context_local = (RunnerContext *)(double)((context->value).vByte & 1);
    break;
  case BYTE:
    context_local = (RunnerContext *)(double)(context->value).vByte;
    break;
  case SHORT:
    context_local = (RunnerContext *)(double)(int)(context->value).vShort;
    break;
  case INT:
    context_local = (RunnerContext *)(double)(context->value).vInt;
    break;
  case FLOAT:
    context_local = (RunnerContext *)(double)(context->value).vFloat;
    break;
  case DOUBLE:
    context_local = (RunnerContext *)(context->value).vString;
    break;
  case LONG:
    context_local = (RunnerContext *)(double)(context->value).vLong;
    break;
  default:
    printf("%s\n","Invalid operator");
    exit(0);
  }
  return (double)context_local;
}

Assistant:

double ContextToDouble(RunnerContext* context){
  int type = (int) context->dataType;
  switch (type) {
    case BOOLEAN: return (double) context->value.vBoolean;
    case BYTE: return (double) context->value.vByte;
    case SHORT: return (double) context->value.vShort;
    case INT: return (double) context->value.vInt;
    case FLOAT: return (double) context->value.vFloat;
    case DOUBLE: return (double) context->value.vDouble;
    case LONG: return (double) context->value.vLong;
  }

  RUNTIME_ERROR("Invalid operator")
}